

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestVerifyInt32::Clear(TestVerifyInt32 *this)

{
  TestAllTypes *this_00;
  anon_union_56_1_493b367e_for_TestVerifyInt32_3 aVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes>>
            (&(this->field_0)._impl_.repeated_all_types_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [56])aVar1 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    this_00 = (this->field_0)._impl_.optional_all_types_;
    if (this_00 == (TestAllTypes *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
                 ,0xbc2f,"_impl_.optional_all_types_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
    edition_unittest::TestAllTypes::Clear(this_00);
  }
  if (((undefined1  [56])aVar1 & (undefined1  [56])0x1e) != (undefined1  [56])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestVerifyInt32::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestVerifyInt32)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_all_types_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.optional_all_types_ != nullptr);
    _impl_.optional_all_types_->Clear();
  }
  if ((cached_has_bits & 0x0000001eu) != 0) {
    ::memset(&_impl_.optional_int32_1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_int32_64_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_1_)) + sizeof(_impl_.optional_int32_64_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}